

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allintra_vis.c
# Opt level: O0

void av1_calc_mb_wiener_var_row
               (AV1_COMP *cpi,MACROBLOCK *x,MACROBLOCKD *xd,int mi_row,int16_t *src_diff,
               tran_low_t *coeff,tran_low_t *qcoeff,tran_low_t *dqcoeff,double *sum_rec_distortion,
               double *sum_est_rate,uint8_t *pred_buffer)

{
  BLOCK_SIZE BVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  MACROBLOCK_PLANE *pMVar6;
  BitDepthInfo bd_info_00;
  BitDepthInfo bd_info_01;
  BitDepthInfo bd_info_02;
  BitDepthInfo bd_info_03;
  uint uVar7;
  int dst_stride;
  int iVar8;
  int ref_stride;
  uint bw;
  uint uVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  tran_low_t *ptVar13;
  MBMIExtFrameBufferInfo *pMVar14;
  int in_ECX;
  int iVar15;
  MACROBLOCKD *in_RDX;
  long *in_RDI;
  tran_low_t *in_R9;
  long lVar16;
  undefined4 *in_stack_00000008;
  double *in_stack_00000018;
  double *in_stack_00000020;
  tran_low_t *in_stack_00000028;
  int abs_qcoeff;
  int idx;
  int max_scale;
  int64_t est_block_dist;
  int est_block_rate;
  uint16_t *rec;
  uint16_t *src;
  int rec_pix;
  int src_pix;
  int pix_col;
  int pix_row;
  int64_t dist_mean;
  int64_t rec_mean;
  int64_t src_mean;
  WeberStats *weber_stats;
  int rate_cost;
  int pix_num;
  QUANT_PARAM quant_param;
  SCAN_ORDER *scan_order;
  uint16_t eob;
  macroblock_plane *p;
  int intra_cost;
  PREDICTION_MODE mode;
  uint8_t *mb_buffer;
  int mi_height;
  int mi_width;
  int best_intra_cost;
  PREDICTION_MODE best_mode;
  _Bool exit;
  AV1EncRowMultiThreadInfo *enc_row_mt;
  int num_workers;
  int mi_col;
  uint16_t *pred_buffer_16;
  int dst_buffer_stride;
  uint8_t *dst_buffer;
  int is_high_bitdepth;
  int mt_unit_col;
  int mt_unit_cols;
  int mt_unit_step;
  int mt_thread_id;
  int mi_cols;
  AV1EncRowMultiThreadSync *intra_row_mt_sync;
  AV1EncAllIntraMultiThreadInfo *intra_mt;
  MultiThreadInfo *mt_info;
  BitDepthInfo bd_info;
  int mb_step;
  int coeff_count;
  int block_size;
  TX_SIZE tx_size;
  BLOCK_SIZE bsize;
  MB_MODE_INFO *mbmi_ptr;
  MB_MODE_INFO mbmi;
  int buf_stride;
  uint8_t *buffer;
  AV1_COMMON *cm;
  MACROBLOCKD *in_stack_fffffffffffffcf8;
  undefined1 *in_stack_fffffffffffffd00;
  tran_low_t *src8;
  MACROBLOCKD *in_stack_fffffffffffffd08;
  ulong uVar17;
  undefined4 in_stack_fffffffffffffd10;
  undefined4 uVar18;
  undefined4 in_stack_fffffffffffffd14;
  MBMIExtFrameBufferInfo *in_stack_fffffffffffffd18;
  MBMIExtFrameBufferInfo *pMVar19;
  undefined2 in_stack_fffffffffffffd20;
  TX_SIZE in_stack_fffffffffffffd22;
  TX_TYPE in_stack_fffffffffffffd23;
  int in_stack_fffffffffffffd24;
  tran_low_t *dqcoeff_00;
  int plane;
  int in_stack_fffffffffffffd34;
  undefined4 uVar20;
  undefined4 in_stack_fffffffffffffd3c;
  undefined4 uVar21;
  int stride;
  undefined4 in_stack_fffffffffffffd44;
  int eob_00;
  undefined4 in_stack_fffffffffffffd4c;
  int in_stack_fffffffffffffd50;
  int in_stack_fffffffffffffd54;
  uint in_stack_fffffffffffffd58;
  uint in_stack_fffffffffffffd5c;
  MACROBLOCK_PLANE *in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd68;
  int in_stack_fffffffffffffd6c;
  MACROBLOCK_PLANE *in_stack_fffffffffffffd70;
  MACROBLOCKD *xd_00;
  undefined4 in_stack_fffffffffffffd80;
  int local_274;
  int local_26c;
  int in_stack_fffffffffffffdb8;
  int in_stack_fffffffffffffdbc;
  int in_stack_fffffffffffffdc0;
  int in_stack_fffffffffffffdc4;
  QUANT_PARAM *in_stack_fffffffffffffdc8;
  uint local_218;
  uint local_214;
  int local_210;
  int local_20c;
  long local_208;
  long local_200;
  long local_1f8;
  undefined1 local_1e0 [15];
  TX_SIZE in_stack_fffffffffffffe2f;
  int in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe34;
  int in_stack_fffffffffffffe38;
  BLOCK_SIZE in_stack_fffffffffffffe3f;
  MACROBLOCKD *in_stack_fffffffffffffe40;
  ushort local_1aa;
  byte local_199;
  int local_188;
  long *in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe88;
  int local_174;
  tran_low_t *in_stack_fffffffffffffe90;
  FILTER_INTRA_MODE in_stack_fffffffffffffe98;
  int local_154;
  undefined4 uVar22;
  long *plVar23;
  long *plVar24;
  MB_MODE_INFO *local_110;
  MB_MODE_INFO local_108;
  int local_54;
  long local_50;
  AV1_COMMON *local_48;
  tran_low_t *local_40;
  int local_2c;
  MACROBLOCKD *local_28;
  long *local_18;
  
  local_48 = (AV1_COMMON *)(in_RDI + 0x77f0);
  local_50 = *(long *)(in_RDI[0x84f5] + 0x28);
  local_54 = *(int *)(in_RDI[0x84f5] + 0x20);
  local_40 = in_R9;
  local_2c = in_ECX;
  local_28 = in_RDX;
  local_18 = in_RDI;
  memset(&local_108,0,0xb0);
  local_110 = &local_108;
  local_28->mi = &local_110;
  BVar1 = *(BLOCK_SIZE *)(local_18 + 0x13abf);
  bVar2 = ""[BVar1];
  iVar4 = tx_size_wide[bVar2];
  uVar7 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[BVar1];
  get_bit_depth_info(in_stack_fffffffffffffcf8);
  plVar24 = local_18 + 0x135c9;
  plVar23 = local_18 + 0x135fb;
  lVar12 = *local_18 + 0x14e08;
  iVar5 = (local_48->mi_params).mi_cols;
  dst_stride = local_2c / (int)uVar7;
  uVar22 = 0x10;
  iVar8 = (iVar5 + 8) / 0x10;
  local_154 = 0;
  ref_stride = is_cur_buf_hbd(local_28);
  ptVar13 = in_stack_00000028;
  if (ref_stride != 0) {
    ptVar13 = (tran_low_t *)((ulong)in_stack_00000028 >> 1);
    in_stack_fffffffffffffe90 = in_stack_00000028;
  }
  for (local_174 = 0; local_174 < iVar5; local_174 = uVar7 + local_174) {
    if (local_174 % 0x10 == 0) {
      (*(code *)plVar23[2])(lVar12,dst_stride,local_154);
      if ((int)plVar24[6] < (int)*plVar24) {
        in_stack_fffffffffffffdb8 = (int)plVar24[6];
      }
      else {
        in_stack_fffffffffffffdb8 = (int)*plVar24;
      }
      in_stack_fffffffffffffe88 = in_stack_fffffffffffffdb8;
      if (1 < in_stack_fffffffffffffdb8) {
        in_stack_fffffffffffffe80 = plVar24 + 10;
        pthread_mutex_lock((pthread_mutex_t *)plVar24[0x2e]);
        bVar3 = *(byte *)((long)in_stack_fffffffffffffe80 + 0x11e);
        pthread_mutex_unlock((pthread_mutex_t *)in_stack_fffffffffffffe80[0x24]);
        if ((bVar3 & 1) != 0) break;
      }
    }
    local_188 = 0x7fffffff;
    bw = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[BVar1];
    uVar9 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                  [BVar1];
    set_mode_info_offsets
              ((CommonModeInfoParams *)
               CONCAT44(in_stack_fffffffffffffd24,
                        CONCAT13(in_stack_fffffffffffffd23,
                                 CONCAT12(in_stack_fffffffffffffd22,in_stack_fffffffffffffd20))),
               in_stack_fffffffffffffd18,
               (MACROBLOCK *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
               in_stack_fffffffffffffd08,(int)((ulong)in_stack_fffffffffffffd00 >> 0x20),
               (int)in_stack_fffffffffffffd00);
    if ((int)(local_2c + uVar9) < (local_48->mi_params).mi_rows) {
      local_26c = local_2c + uVar9;
    }
    else {
      local_26c = (local_48->mi_params).mi_rows;
    }
    if ((int)(local_174 + bw) < (local_48->mi_params).mi_cols) {
      local_274 = local_174 + bw;
    }
    else {
      local_274 = (local_48->mi_params).mi_cols;
    }
    iVar15 = local_174;
    set_mi_row_col(local_28,&local_28->tile,local_2c,uVar9,local_174,bw,local_26c,local_274);
    uVar9 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                  [BVar1];
    bVar3 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[BVar1];
    xd_00 = local_28;
    iVar10 = av1_num_planes(local_48);
    set_plane_n4(xd_00,uVar9,(uint)bVar3,iVar10);
    (*local_28->mi)->bsize = BVar1;
    (*local_28->mi)->motion_mode = '\0';
    if ((local_28->up_available & 1U) != 0) {
      local_28->above_mbmi = (MB_MODE_INFO *)0x0;
    }
    if ((local_28->left_available & 1U) != 0) {
      local_28->left_mbmi = (MB_MODE_INFO *)0x0;
    }
    pMVar14 = (MBMIExtFrameBufferInfo *)
              (local_50 + local_2c * 4 * local_54 + (long)(local_174 << 2));
    local_199 = 0;
    dqcoeff_00 = ptVar13;
    while( true ) {
      in_stack_fffffffffffffd22 = (TX_SIZE)((uint)local_54 >> 0x10);
      in_stack_fffffffffffffd23 = (TX_TYPE)((uint)local_54 >> 0x18);
      in_stack_fffffffffffffd20 = (undefined2)local_54;
      if (0xc < local_199) break;
      uVar18 = 5;
      iVar10 = 0x80;
      uVar20 = 0;
      uVar21 = 0;
      pMVar19 = pMVar14;
      ptVar13 = dqcoeff_00;
      av1_predict_intra_block
                (in_stack_fffffffffffffe40,in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38,
                 in_stack_fffffffffffffe34,in_stack_fffffffffffffe30,in_stack_fffffffffffffe2f,
                 (PREDICTION_MODE)in_stack_fffffffffffffe80,in_stack_fffffffffffffe88,
                 (int)in_stack_fffffffffffffe90,in_stack_fffffffffffffe98,(uint8_t *)dqcoeff_00,
                 ref_stride,(uint8_t *)CONCAT44(uVar22,iVar8),dst_stride,(int)lVar12,(int)plVar23,
                 (int)plVar24);
      bd_info_00.bit_depth._2_1_ = in_stack_fffffffffffffd22;
      bd_info_00.bit_depth._0_2_ = in_stack_fffffffffffffd20;
      bd_info_00.bit_depth._3_1_ = in_stack_fffffffffffffd23;
      bd_info_00.use_highbitdepth_buf = in_stack_fffffffffffffd24;
      av1_subtract_block(bd_info_00,(int)((ulong)pMVar19 >> 0x20),(int)pMVar19,
                         (int16_t *)CONCAT44(in_stack_fffffffffffffd14,uVar18),0x80,
                         (uint8_t *)ptVar13,CONCAT44(in_stack_fffffffffffffd34,iVar10),
                         (uint8_t *)CONCAT44(in_stack_fffffffffffffd3c,uVar20),
                         CONCAT44(in_stack_fffffffffffffd44,uVar21));
      bd_info_02.use_highbitdepth_buf = in_stack_fffffffffffffd34;
      bd_info_02.bit_depth = iVar10;
      av1_quick_txfm((int)((ulong)dqcoeff_00 >> 0x20),(TX_SIZE)((ulong)dqcoeff_00 >> 0x18),
                     bd_info_02,
                     (int16_t *)
                     CONCAT44(in_stack_fffffffffffffd24,
                              CONCAT13(in_stack_fffffffffffffd23,
                                       CONCAT12(in_stack_fffffffffffffd22,in_stack_fffffffffffffd20)
                                      )),(int)((ulong)pMVar19 >> 0x20),
                     (tran_low_t *)CONCAT44(in_stack_fffffffffffffd14,uVar18));
      iVar10 = (*aom_satd)(local_40,iVar4 * iVar4);
      if (iVar10 < local_188) {
        local_188 = iVar10;
      }
      local_199 = local_199 + 1;
      dqcoeff_00 = ptVar13;
    }
    in_stack_fffffffffffffd10 = 5;
    plane = 0x80;
    uVar18 = 0;
    stride = 0;
    eob_00 = 0;
    in_stack_fffffffffffffd18 = pMVar14;
    src8 = dqcoeff_00;
    av1_predict_intra_block
              (in_stack_fffffffffffffe40,in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38,
               in_stack_fffffffffffffe34,in_stack_fffffffffffffe30,in_stack_fffffffffffffe2f,
               (PREDICTION_MODE)in_stack_fffffffffffffe80,in_stack_fffffffffffffe88,
               (int)in_stack_fffffffffffffe90,in_stack_fffffffffffffe98,(uint8_t *)dqcoeff_00,
               ref_stride,(uint8_t *)CONCAT44(uVar22,iVar8),dst_stride,(int)lVar12,(int)plVar23,
               (int)plVar24);
    lVar16 = (long)local_54;
    uVar17 = 0;
    bd_info_01.bit_depth._2_1_ = in_stack_fffffffffffffd22;
    bd_info_01.bit_depth._0_2_ = in_stack_fffffffffffffd20;
    bd_info_01.bit_depth._3_1_ = in_stack_fffffffffffffd23;
    bd_info_01.use_highbitdepth_buf = in_stack_fffffffffffffd24;
    ptVar13 = src8;
    av1_subtract_block(bd_info_01,(int)((ulong)in_stack_fffffffffffffd18 >> 0x20),
                       (int)in_stack_fffffffffffffd18,
                       (int16_t *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),0x80
                       ,(uint8_t *)src8,CONCAT44(in_stack_fffffffffffffd34,plane),
                       (uint8_t *)CONCAT44(in_stack_fffffffffffffd3c,uVar18),
                       CONCAT44(in_stack_fffffffffffffd44,stride));
    bd_info_03.use_highbitdepth_buf = in_stack_fffffffffffffd34;
    bd_info_03.bit_depth = plane;
    av1_quick_txfm((int)((ulong)dqcoeff_00 >> 0x20),(TX_SIZE)((ulong)dqcoeff_00 >> 0x18),bd_info_03,
                   (int16_t *)
                   CONCAT44(in_stack_fffffffffffffd24,
                            CONCAT13(in_stack_fffffffffffffd23,
                                     CONCAT12(in_stack_fffffffffffffd22,in_stack_fffffffffffffd20)))
                   ,(int)((ulong)in_stack_fffffffffffffd18 >> 0x20),
                   (tran_low_t *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
    iVar10 = 1 << ("\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"
                   [txsize_to_bsize[bVar2]] & 0x1f);
    av1_setup_quant((TX_SIZE)((ulong)src8 >> 0x38),(int)src8,(int)((ulong)lVar16 >> 0x20),
                    (int)lVar16,(QUANT_PARAM *)0x1d7781);
    iVar11 = is_cur_buf_hbd(local_28);
    if (iVar11 == 0) {
      uVar20 = (undefined4)((ulong)local_1e0 >> 0x20);
      av1_quantize_fp_facade
                ((tran_low_t *)CONCAT44(uVar9,in_stack_fffffffffffffd80),(intptr_t)xd_00,
                 in_stack_fffffffffffffd70,
                 (tran_low_t *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                 (tran_low_t *)in_stack_fffffffffffffd60,
                 (uint16_t *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                 (SCAN_ORDER *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                 in_stack_fffffffffffffdc8);
    }
    else {
      uVar20 = (undefined4)((ulong)local_1e0 >> 0x20);
      av1_highbd_quantize_fp_facade
                ((tran_low_t *)in_stack_fffffffffffffd70,
                 CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                 in_stack_fffffffffffffd60,
                 (tran_low_t *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                 (tran_low_t *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                 (uint16_t *)CONCAT44(in_stack_fffffffffffffd4c,eob_00),
                 (SCAN_ORDER *)CONCAT44(bw,iVar15),
                 (QUANT_PARAM *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
    }
    if ((int)local_18[0x84f0] != 0) {
      in_stack_fffffffffffffd6c =
           rate_estimator((tran_low_t *)
                          CONCAT44(in_stack_fffffffffffffd24,
                                   CONCAT13(in_stack_fffffffffffffd23,
                                            CONCAT12(in_stack_fffffffffffffd22,
                                                     in_stack_fffffffffffffd20))),
                          (int)((ulong)in_stack_fffffffffffffd18 >> 0x20),
                          (TX_SIZE)((ulong)in_stack_fffffffffffffd18 >> 0x18));
      in_stack_fffffffffffffd70 = (MACROBLOCK_PLANE *)local_18[0x13abc];
      *(int *)((long)&in_stack_fffffffffffffd70->src_diff +
              (long)((local_2c / (int)uVar7) * *(int *)((long)local_18 + 0x712d4) +
                    local_174 / (int)uVar7) * 4) = in_stack_fffffffffffffd6c;
    }
    in_stack_fffffffffffffd00 = (undefined1 *)CONCAT44(uVar20,(uint)local_1aa);
    in_stack_fffffffffffffd08 = (MACROBLOCKD *)(uVar17 & 0xffffffff00000000);
    av1_inverse_transform_block
              ((MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffd34,plane),dqcoeff_00,
               in_stack_fffffffffffffd24,in_stack_fffffffffffffd23,in_stack_fffffffffffffd22,
               (uint8_t *)in_stack_fffffffffffffd18,stride,eob_00,in_stack_fffffffffffffd50);
    pMVar6 = (MACROBLOCK_PLANE *)local_18[0x13abb];
    iVar15 = (local_2c / (int)uVar7) * *(int *)((long)local_18 + 0x712d4) + local_174 / (int)uVar7;
    *(undefined2 *)((long)&pMVar6->coeff + (long)iVar15 * 0x38 + 2) = 1;
    (&pMVar6->qcoeff)[(long)iVar15 * 7] = (tran_low_t *)0x0;
    *(undefined2 *)(&pMVar6->coeff + (long)iVar15 * 7) = 1;
    (&pMVar6->dqcoeff)[(long)iVar15 * 7] = (tran_low_t *)0x0;
    (&pMVar6->eobs)[(long)iVar15 * 7] = (uint16_t *)0x0;
    local_1f8 = 0;
    local_200 = 0;
    local_208 = 0;
    in_stack_fffffffffffffd60 = pMVar6;
    for (local_20c = 0; local_20c < iVar4; local_20c = local_20c + 1) {
      for (local_210 = 0; local_210 < iVar4; local_210 = local_210 + 1) {
        iVar11 = is_cur_buf_hbd(local_28);
        if (iVar11 == 0) {
          local_214 = (uint)*(byte *)((long)&pMVar14->frame_base +
                                     (long)(local_20c * local_54 + local_210));
          local_218 = (uint)*(byte *)((long)ptVar13 + (long)(local_20c * 0x80 + local_210));
        }
        else {
          local_214 = (uint)*(ushort *)
                             ((long)pMVar14 * 2 + (long)(local_20c * local_54 + local_210) * 2);
          local_218 = (uint)*(ushort *)
                             ((long)ptVar13 * 2 + (long)(local_20c * 0x80 + local_210) * 2);
        }
        local_1f8 = (int)local_214 + local_1f8;
        local_200 = (int)local_218 + local_200;
        local_208 = (int)(local_214 - local_218) + local_208;
        (&pMVar6->dqcoeff)[(long)iVar15 * 7] =
             (tran_low_t *)
             ((long)(int)(local_214 * local_214) + (long)(&pMVar6->dqcoeff)[(long)iVar15 * 7]);
        (&pMVar6->qcoeff)[(long)iVar15 * 7] =
             (tran_low_t *)
             ((long)(int)(local_218 * local_218) + (long)(&pMVar6->qcoeff)[(long)iVar15 * 7]);
        in_stack_fffffffffffffd5c = local_214;
        if ((int)local_214 < (int)*(short *)(&pMVar6->coeff + (long)iVar15 * 7)) {
          in_stack_fffffffffffffd5c = (int)*(short *)(&pMVar6->coeff + (long)iVar15 * 7);
        }
        *(short *)(&pMVar6->coeff + (long)iVar15 * 7) = (short)in_stack_fffffffffffffd5c;
        in_stack_fffffffffffffd58 = local_218;
        if ((int)local_218 < (int)*(short *)((long)&pMVar6->coeff + (long)iVar15 * 0x38 + 2)) {
          in_stack_fffffffffffffd58 =
               (int)*(short *)((long)&pMVar6->coeff + (long)iVar15 * 0x38 + 2);
        }
        *(short *)((long)&pMVar6->coeff + (long)iVar15 * 0x38 + 2) =
             (short)in_stack_fffffffffffffd58;
        (&pMVar6->eobs)[(long)iVar15 * 7] =
             (uint16_t *)
             ((long)(int)((local_214 - local_218) * (local_214 - local_218)) +
             (long)(&pMVar6->eobs)[(long)iVar15 * 7]);
      }
    }
    if ((*(byte *)((long)local_18 + 0x426ef) & 1) != 0) {
      *in_stack_00000018 = (double)(long)(&pMVar6->eobs)[(long)iVar15 * 7] + *in_stack_00000018;
      in_stack_fffffffffffffdc8 = (QUANT_PARAM *)0x0;
      in_stack_fffffffffffffd00 = &stack0xfffffffffffffdc8;
      model_rd_from_sse((AV1_COMP *)CONCAT44(in_stack_fffffffffffffd44,stride),
                        (MACROBLOCK *)CONCAT44(in_stack_fffffffffffffd3c,uVar18),
                        (BLOCK_SIZE)((uint)in_stack_fffffffffffffd34 >> 0x18),plane,
                        (int64_t)dqcoeff_00,in_stack_fffffffffffffd24,
                        (int *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                        (int64_t *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
      *in_stack_00000020 = *in_stack_00000020 + 0.0;
    }
    (&pMVar6->dqcoeff)[(long)iVar15 * 7] =
         (tran_low_t *)
         ((long)(&pMVar6->dqcoeff)[(long)iVar15 * 7] - (local_1f8 * local_1f8) / (long)iVar10);
    (&pMVar6->qcoeff)[(long)iVar15 * 7] =
         (tran_low_t *)
         ((long)(&pMVar6->qcoeff)[(long)iVar15 * 7] - (local_200 * local_200) / (long)iVar10);
    (&pMVar6->eobs)[(long)iVar15 * 7] =
         (uint16_t *)
         ((long)(&pMVar6->eobs)[(long)iVar15 * 7] - (local_208 * local_208) / (long)iVar10);
    (&pMVar6->txb_entropy_ctx)[(long)iVar15 * 7] = (uint8_t *)(long)local_188;
    *in_stack_00000008 = 0;
    in_stack_fffffffffffffdc4 = 0;
    for (in_stack_fffffffffffffdc0 = 1; in_stack_fffffffffffffdc0 < iVar4 * iVar4;
        in_stack_fffffffffffffdc0 = in_stack_fffffffffffffdc0 + 1) {
      in_stack_fffffffffffffdbc = in_stack_00000008[in_stack_fffffffffffffdc0];
      if (in_stack_fffffffffffffdbc < 1) {
        in_stack_fffffffffffffdbc = -in_stack_fffffffffffffdbc;
      }
      in_stack_fffffffffffffd54 = in_stack_fffffffffffffdbc;
      if (in_stack_fffffffffffffdbc < in_stack_fffffffffffffdc4) {
        in_stack_fffffffffffffd54 = in_stack_fffffffffffffdc4;
      }
      in_stack_fffffffffffffdc4 = in_stack_fffffffffffffd54;
    }
    *(double *)((long)&pMVar6->src + (long)iVar15 * 0x38) = (double)in_stack_fffffffffffffdc4;
    if (((int)(local_174 + uVar7) % 0x10 == 0) || (iVar5 <= (int)(local_174 + uVar7))) {
      (*(code *)plVar23[3])(lVar12,dst_stride,local_154,iVar8);
      local_154 = local_154 + 1;
    }
  }
  local_28->mi = (MB_MODE_INFO **)0x0;
  return;
}

Assistant:

void av1_calc_mb_wiener_var_row(AV1_COMP *const cpi, MACROBLOCK *x,
                                MACROBLOCKD *xd, const int mi_row,
                                int16_t *src_diff, tran_low_t *coeff,
                                tran_low_t *qcoeff, tran_low_t *dqcoeff,
                                double *sum_rec_distortion,
                                double *sum_est_rate, uint8_t *pred_buffer) {
  AV1_COMMON *const cm = &cpi->common;
  uint8_t *buffer = cpi->source->y_buffer;
  int buf_stride = cpi->source->y_stride;
  MB_MODE_INFO mbmi;
  memset(&mbmi, 0, sizeof(mbmi));
  MB_MODE_INFO *mbmi_ptr = &mbmi;
  xd->mi = &mbmi_ptr;
  const BLOCK_SIZE bsize = cpi->weber_bsize;
  const TX_SIZE tx_size = max_txsize_lookup[bsize];
  const int block_size = tx_size_wide[tx_size];
  const int coeff_count = block_size * block_size;
  const int mb_step = mi_size_wide[bsize];
  const BitDepthInfo bd_info = get_bit_depth_info(xd);
  const MultiThreadInfo *const mt_info = &cpi->mt_info;
  const AV1EncAllIntraMultiThreadInfo *const intra_mt = &mt_info->intra_mt;
  AV1EncRowMultiThreadSync *const intra_row_mt_sync =
      &cpi->ppi->intra_row_mt_sync;
  const int mi_cols = cm->mi_params.mi_cols;
  const int mt_thread_id = mi_row / mb_step;
  // TODO(chengchen): test different unit step size
  const int mt_unit_step = mi_size_wide[MB_WIENER_MT_UNIT_SIZE];
  const int mt_unit_cols = (mi_cols + (mt_unit_step >> 1)) / mt_unit_step;
  int mt_unit_col = 0;
  const int is_high_bitdepth = is_cur_buf_hbd(xd);

  uint8_t *dst_buffer = pred_buffer;
  const int dst_buffer_stride = MB_WIENER_PRED_BUF_STRIDE;

  if (is_high_bitdepth) {
    uint16_t *pred_buffer_16 = (uint16_t *)pred_buffer;
    dst_buffer = CONVERT_TO_BYTEPTR(pred_buffer_16);
  }

  for (int mi_col = 0; mi_col < mi_cols; mi_col += mb_step) {
    if (mi_col % mt_unit_step == 0) {
      intra_mt->intra_sync_read_ptr(intra_row_mt_sync, mt_thread_id,
                                    mt_unit_col);
#if CONFIG_MULTITHREAD
      const int num_workers =
          AOMMIN(mt_info->num_mod_workers[MOD_AI], mt_info->num_workers);
      if (num_workers > 1) {
        const AV1EncRowMultiThreadInfo *const enc_row_mt = &mt_info->enc_row_mt;
        pthread_mutex_lock(enc_row_mt->mutex_);
        const bool exit = enc_row_mt->mb_wiener_mt_exit;
        pthread_mutex_unlock(enc_row_mt->mutex_);
        // Stop further processing in case any worker has encountered an error.
        if (exit) break;
      }
#endif
    }

    PREDICTION_MODE best_mode = DC_PRED;
    int best_intra_cost = INT_MAX;
    const int mi_width = mi_size_wide[bsize];
    const int mi_height = mi_size_high[bsize];
    set_mode_info_offsets(&cpi->common.mi_params, &cpi->mbmi_ext_info, x, xd,
                          mi_row, mi_col);
    set_mi_row_col(xd, &xd->tile, mi_row, mi_height, mi_col, mi_width,
                   AOMMIN(mi_row + mi_height, cm->mi_params.mi_rows),
                   AOMMIN(mi_col + mi_width, cm->mi_params.mi_cols));
    set_plane_n4(xd, mi_size_wide[bsize], mi_size_high[bsize],
                 av1_num_planes(cm));
    xd->mi[0]->bsize = bsize;
    xd->mi[0]->motion_mode = SIMPLE_TRANSLATION;
    // Set above and left mbmi to NULL as they are not available in the
    // preprocessing stage.
    // They are used to detemine intra edge filter types in intra prediction.
    if (xd->up_available) {
      xd->above_mbmi = NULL;
    }
    if (xd->left_available) {
      xd->left_mbmi = NULL;
    }
    uint8_t *mb_buffer =
        buffer + mi_row * MI_SIZE * buf_stride + mi_col * MI_SIZE;
    for (PREDICTION_MODE mode = INTRA_MODE_START; mode < INTRA_MODE_END;
         ++mode) {
      // TODO(chengchen): Here we use src instead of reconstructed frame as
      // the intra predictor to make single and multithread version match.
      // Ideally we want to use the reconstructed.
      av1_predict_intra_block(
          xd, cm->seq_params->sb_size, cm->seq_params->enable_intra_edge_filter,
          block_size, block_size, tx_size, mode, 0, 0, FILTER_INTRA_MODES,
          mb_buffer, buf_stride, dst_buffer, dst_buffer_stride, 0, 0, 0);
      av1_subtract_block(bd_info, block_size, block_size, src_diff, block_size,
                         mb_buffer, buf_stride, dst_buffer, dst_buffer_stride);
      av1_quick_txfm(0, tx_size, bd_info, src_diff, block_size, coeff);
      int intra_cost = aom_satd(coeff, coeff_count);
      if (intra_cost < best_intra_cost) {
        best_intra_cost = intra_cost;
        best_mode = mode;
      }
    }

    av1_predict_intra_block(
        xd, cm->seq_params->sb_size, cm->seq_params->enable_intra_edge_filter,
        block_size, block_size, tx_size, best_mode, 0, 0, FILTER_INTRA_MODES,
        mb_buffer, buf_stride, dst_buffer, dst_buffer_stride, 0, 0, 0);
    av1_subtract_block(bd_info, block_size, block_size, src_diff, block_size,
                       mb_buffer, buf_stride, dst_buffer, dst_buffer_stride);
    av1_quick_txfm(0, tx_size, bd_info, src_diff, block_size, coeff);

    const struct macroblock_plane *const p = &x->plane[0];
    uint16_t eob;
    const SCAN_ORDER *const scan_order = &av1_scan_orders[tx_size][DCT_DCT];
    QUANT_PARAM quant_param;
    int pix_num = 1 << num_pels_log2_lookup[txsize_to_bsize[tx_size]];
    av1_setup_quant(tx_size, 0, AV1_XFORM_QUANT_FP, 0, &quant_param);
#if CONFIG_AV1_HIGHBITDEPTH
    if (is_cur_buf_hbd(xd)) {
      av1_highbd_quantize_fp_facade(coeff, pix_num, p, qcoeff, dqcoeff, &eob,
                                    scan_order, &quant_param);
    } else {
      av1_quantize_fp_facade(coeff, pix_num, p, qcoeff, dqcoeff, &eob,
                             scan_order, &quant_param);
    }
#else
    av1_quantize_fp_facade(coeff, pix_num, p, qcoeff, dqcoeff, &eob, scan_order,
                           &quant_param);
#endif  // CONFIG_AV1_HIGHBITDEPTH

    if (cpi->oxcf.enable_rate_guide_deltaq) {
      const int rate_cost = rate_estimator(qcoeff, eob, tx_size);
      cpi->prep_rate_estimates[(mi_row / mb_step) * cpi->frame_info.mi_cols +
                               (mi_col / mb_step)] = rate_cost;
    }

    av1_inverse_transform_block(xd, dqcoeff, 0, DCT_DCT, tx_size, dst_buffer,
                                dst_buffer_stride, eob, 0);
    WeberStats *weber_stats =
        &cpi->mb_weber_stats[(mi_row / mb_step) * cpi->frame_info.mi_cols +
                             (mi_col / mb_step)];

    weber_stats->rec_pix_max = 1;
    weber_stats->rec_variance = 0;
    weber_stats->src_pix_max = 1;
    weber_stats->src_variance = 0;
    weber_stats->distortion = 0;

    int64_t src_mean = 0;
    int64_t rec_mean = 0;
    int64_t dist_mean = 0;

    for (int pix_row = 0; pix_row < block_size; ++pix_row) {
      for (int pix_col = 0; pix_col < block_size; ++pix_col) {
        int src_pix, rec_pix;
#if CONFIG_AV1_HIGHBITDEPTH
        if (is_cur_buf_hbd(xd)) {
          uint16_t *src = CONVERT_TO_SHORTPTR(mb_buffer);
          uint16_t *rec = CONVERT_TO_SHORTPTR(dst_buffer);
          src_pix = src[pix_row * buf_stride + pix_col];
          rec_pix = rec[pix_row * dst_buffer_stride + pix_col];
        } else {
          src_pix = mb_buffer[pix_row * buf_stride + pix_col];
          rec_pix = dst_buffer[pix_row * dst_buffer_stride + pix_col];
        }
#else
        src_pix = mb_buffer[pix_row * buf_stride + pix_col];
        rec_pix = dst_buffer[pix_row * dst_buffer_stride + pix_col];
#endif
        src_mean += src_pix;
        rec_mean += rec_pix;
        dist_mean += src_pix - rec_pix;
        weber_stats->src_variance += src_pix * src_pix;
        weber_stats->rec_variance += rec_pix * rec_pix;
        weber_stats->src_pix_max = AOMMAX(weber_stats->src_pix_max, src_pix);
        weber_stats->rec_pix_max = AOMMAX(weber_stats->rec_pix_max, rec_pix);
        weber_stats->distortion += (src_pix - rec_pix) * (src_pix - rec_pix);
      }
    }

    if (cpi->oxcf.intra_mode_cfg.auto_intra_tools_off) {
      *sum_rec_distortion += weber_stats->distortion;
      int est_block_rate = 0;
      int64_t est_block_dist = 0;
      model_rd_sse_fn[MODELRD_LEGACY](cpi, x, bsize, 0, weber_stats->distortion,
                                      pix_num, &est_block_rate,
                                      &est_block_dist);
      *sum_est_rate += est_block_rate;
    }

    weber_stats->src_variance -= (src_mean * src_mean) / pix_num;
    weber_stats->rec_variance -= (rec_mean * rec_mean) / pix_num;
    weber_stats->distortion -= (dist_mean * dist_mean) / pix_num;
    weber_stats->satd = best_intra_cost;

    qcoeff[0] = 0;
    int max_scale = 0;
    for (int idx = 1; idx < coeff_count; ++idx) {
      const int abs_qcoeff = abs(qcoeff[idx]);
      max_scale = AOMMAX(max_scale, abs_qcoeff);
    }
    weber_stats->max_scale = max_scale;

    if ((mi_col + mb_step) % mt_unit_step == 0 ||
        (mi_col + mb_step) >= mi_cols) {
      intra_mt->intra_sync_write_ptr(intra_row_mt_sync, mt_thread_id,
                                     mt_unit_col, mt_unit_cols);
      ++mt_unit_col;
    }
  }
  // Set the pointer to null since mbmi is only allocated inside this function.
  xd->mi = NULL;
}